

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * container_from_range(uint8_t *type,uint32_t min,uint32_t max,uint16_t step)

{
  uint size;
  container_t *pcVar1;
  array_container_t *arr;
  int iVar2;
  undefined6 in_register_0000000a;
  
  iVar2 = (int)CONCAT62(in_register_0000000a,step);
  if (iVar2 == 0) {
    arr = (array_container_t *)0x0;
  }
  else {
    if (iVar2 == 1) {
      pcVar1 = container_range_of_ones(min,max,type);
      return pcVar1;
    }
    size = (~min + max + (uint)step) / (uint)step;
    if (size < 0x1001) {
      *type = '\x02';
      arr = array_container_create_given_capacity(size);
      array_container_add_from_range(arr,min,max,step);
    }
    else {
      *type = '\x01';
      arr = (array_container_t *)bitset_container_create();
      bitset_container_add_from_range((bitset_container_t *)arr,min,max,step);
    }
  }
  return arr;
}

Assistant:

static inline container_t *container_from_range(uint8_t *type, uint32_t min,
                                                uint32_t max, uint16_t step) {
    if (step == 0) return NULL;  // being paranoid
    if (step == 1) {
        return container_range_of_ones(min, max, type);
        // Note: the result is not always a run (need to check the cardinality)
        //*type = RUN_CONTAINER_TYPE;
        // return run_container_create_range(min, max);
    }
    int size = (max - min + step - 1) / step;
    if (size <= DEFAULT_MAX_SIZE) {  // array container
        *type = ARRAY_CONTAINER_TYPE;
        array_container_t *array = array_container_create_given_capacity(size);
        array_container_add_from_range(array, min, max, step);
        assert(array->cardinality == size);
        return array;
    } else {  // bitset container
        *type = BITSET_CONTAINER_TYPE;
        bitset_container_t *bitset = bitset_container_create();
        bitset_container_add_from_range(bitset, min, max, step);
        assert(bitset->cardinality == size);
        return bitset;
    }
}